

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O3

lzham_compress_status_t
lzham::lzham_lib_compress_memory
          (lzham_compress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  lzham_compress_status_t lVar4;
  int iVar5;
  lzham *this;
  lzcompressor *this_00;
  ulong *puVar6;
  ulong __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  task_pool *ctx;
  task_pool *local_88;
  init_params local_70;
  
  if (pDst_len == (size_t *)0x0 || pParams == (lzham_compress_params *)0x0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  puVar6 = (ulong *)CONCAT71((int7)((ulong)pSrc_buf >> 8),src_len != 0);
  if (src_len >> 0x20 != 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  if (pSrc_buf == (lzham_uint8 *)0x0 && src_len != 0) {
    return LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  local_70.m_pTask_pool = (task_pool *)0x0;
  local_70.m_max_helper_threads = 0;
  local_70.m_compression_level = cCompressionLevelDefault;
  local_70.m_dict_size_log2 = 0x16;
  local_70.m_block_size = 0x80000;
  local_70.m_lzham_compress_flags = 0;
  local_70.m_pSeed_bytes = (void *)0x0;
  local_70.m_num_seed_bytes = 0;
  local_70.m_table_max_update_interval = 0;
  local_70.m_table_update_interval_slow_rate = 0;
  local_70.m_extreme_parsing_max_best_arrivals = 4;
  local_70.m_fast_bytes_override = 0;
  lVar4 = create_internal_init_params(&local_70,pParams);
  if (lVar4 != LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
    return lVar4;
  }
  this = (lzham *)lzham::lzham_create_malloc_context((lzham *)0x0,(uint)pParams);
  uVar2 = local_70._8_8_;
  if (local_70.m_max_helper_threads == 0) {
    local_88 = (task_pool *)0x0;
    ctx = (task_pool *)0xc0ebf0;
    this_00 = (lzcompressor *)lzham::lzham_malloc(this,(void *)0xc0ebf0,0,puVar6);
    if (this_00 != (lzcompressor *)0x0) {
LAB_001060a5:
      lzcompressor::lzcompressor(this_00,this);
      iVar5 = lzcompressor::init(this_00,(EVP_PKEY_CTX *)&local_70);
      if ((char)iVar5 == '\0') {
        if (local_88 != (task_pool *)0x0) {
          task_pool::~task_pool(local_88);
          lzham::lzham_free(this,local_88,extraout_RDX_00);
        }
        lzcompressor::~lzcompressor(this_00);
        lzham::lzham_free(this,this_00,extraout_RDX_01);
        lzham::lzham_destroy_malloc_context(this,this_00);
        return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }
      if ((src_len == 0) || (bVar3 = lzcompressor::put_bytes(this_00,pSrc_buf,(uint)src_len), bVar3)
         ) {
        bVar3 = lzcompressor::put_bytes(this_00,(void *)0x0,0);
        if (bVar3) {
          uVar1 = *pDst_len;
          *pDst_len = (ulong)(this_00->m_comp_buf).m_size;
          if (pAdler32 != (lzham_uint32 *)0x0) {
            *pAdler32 = this_00->m_src_adler32;
          }
          __n = (ulong)(this_00->m_comp_buf).m_size;
          if (uVar1 < __n) {
            lzham_delete<lzham::task_pool>(this,local_88);
            lzcompressor::~lzcompressor(this_00);
            lzham::lzham_free(this,this_00,extraout_RDX);
            lzham::lzham_destroy_malloc_context(this,this_00);
            return LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
          }
          memcpy(pDst_buf,(this_00->m_comp_buf).m_p,__n);
          lzham_delete<lzham::task_pool>(this,local_88);
          lzcompressor::~lzcompressor(this_00);
          lzham::lzham_free(this,this_00,extraout_RDX_05);
          lzham::lzham_destroy_malloc_context(this,this_00);
          return LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
        }
        *pDst_len = 0;
        lzham_delete<lzham::task_pool>(this,local_88);
        lzcompressor::~lzcompressor(this_00);
        lzham::lzham_free(this,this_00,extraout_RDX_03);
      }
      else {
        *pDst_len = 0;
        lzham_delete<lzham::task_pool>(this,local_88);
        lzcompressor::~lzcompressor(this_00);
        lzham::lzham_free(this,this_00,extraout_RDX_04);
      }
      lzham::lzham_destroy_malloc_context(this,this_00);
      return LZHAM_COMP_STATUS_FAILED;
    }
  }
  else {
    local_88 = (task_pool *)lzham::lzham_malloc(this,(void *)0xa50,0,puVar6);
    if (local_88 != (task_pool *)0x0) {
      task_pool::task_pool(local_88,this);
    }
    ctx = (task_pool *)(uVar2 & 0xffffffff);
    iVar5 = task_pool::init(local_88,(EVP_PKEY_CTX *)ctx);
    if ((char)iVar5 != '\0') {
      local_70.m_pTask_pool = local_88;
      this_00 = (lzcompressor *)lzham::lzham_malloc(this,(void *)0xc0ebf0,0,puVar6);
      if (this_00 != (lzcompressor *)0x0) goto LAB_001060a5;
      task_pool::~task_pool(local_88);
      lzham::lzham_free(this,local_88,extraout_RDX_02);
      ctx = local_88;
    }
  }
  lzham::lzham_destroy_malloc_context(this,ctx);
  return LZHAM_COMP_STATUS_FAILED_INITIALIZING;
}

Assistant:

lzham_compress_status_t LZHAM_CDECL lzham_lib_compress_memory(const lzham_compress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if ((!pParams) || (!pDst_len))
      {
         LZHAM_LOG_ERROR(6019);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pSrc_buf)
         {
            LZHAM_LOG_ERROR(6020);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }
      }

      if (sizeof(size_t) > sizeof(uint32))
      {
         if (src_len > cUINT32_MAX)
         {
            LZHAM_LOG_ERROR(6021);
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }
      }

      lzcompressor::init_params internal_params;
      lzham_compress_status_t status = create_internal_init_params(internal_params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
      {
         LZHAM_LOG_ERROR(6022);
         return status;
      }

      lzham_malloc_context malloc_context = lzham_create_malloc_context(0);

      task_pool *pTP = NULL;
      if (internal_params.m_max_helper_threads)
      {
         pTP = lzham_new<task_pool>(malloc_context, malloc_context);
         if (!pTP->init(internal_params.m_max_helper_threads))
         {
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6023);
            return LZHAM_COMP_STATUS_FAILED_INITIALIZING;
         }

         internal_params.m_pTask_pool = pTP;
      }

      lzcompressor *pCompressor = lzham_new<lzcompressor>(malloc_context, malloc_context);
      if (!pCompressor)
      {
         lzham_delete(malloc_context, pTP);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6024);
         return LZHAM_COMP_STATUS_FAILED_INITIALIZING;
      }

      if (!pCompressor->init(internal_params))
      {
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6025);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pCompressor->put_bytes(pSrc_buf, static_cast<uint32>(src_len)))
         {
            *pDst_len = 0;
            lzham_delete(malloc_context, pTP);
            lzham_delete(malloc_context, pCompressor);
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6026);
            return LZHAM_COMP_STATUS_FAILED;
         }
      }

      if (!pCompressor->put_bytes(NULL, 0))
      {
         *pDst_len = 0;
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6027);
         return LZHAM_COMP_STATUS_FAILED;
      }

      const byte_vec &comp_data = pCompressor->get_compressed_data();

      size_t dst_buf_size = *pDst_len;
      *pDst_len = comp_data.size();

      if (pAdler32)
         *pAdler32 = pCompressor->get_src_adler32();

      if (comp_data.size() > dst_buf_size)
      {
         lzham_delete(malloc_context, pTP);
         lzham_delete(malloc_context, pCompressor);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6028);
         return LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
      }

      memcpy(pDst_buf, comp_data.get_ptr(), comp_data.size());

      lzham_delete(malloc_context, pTP);
      lzham_delete(malloc_context, pCompressor);
      lzham_destroy_malloc_context(malloc_context);
      return LZHAM_COMP_STATUS_SUCCESS;
   }